

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::get_subcommand(App *this,string *subcom)

{
  App *pAVar1;
  OptionNotFound *this_00;
  string sStack_38;
  
  pAVar1 = _find_subcommand(this,subcom,false,false);
  if (pAVar1 != (App *)0x0) {
    return pAVar1;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string
            ((string *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)subcom);
  OptionNotFound::OptionNotFound(this_00,&sStack_38);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *get_subcommand(std::string subcom) const {
        auto subc = _find_subcommand(subcom, false, false);
        if(subc == nullptr)
            throw OptionNotFound(subcom);
        return subc;
    }